

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v11::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  wchar_t *pwVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char *extraout_RDX;
  char *ptr;
  char *extraout_RDX_00;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  char local_30 [8];
  
  pcVar5 = (char *)s.size_;
  pcVar6 = s.data_;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>.grow_ =
       basic_memory_buffer<wchar_t,_500UL,_fmt::v11::detail::allocator<wchar_t>_>::grow;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  pcVar2 = pcVar6;
  ptr = pcVar5;
  if (pcVar5 < (char *)0x4) {
LAB_001d8fd5:
    lVar8 = (long)(pcVar6 + (long)pcVar5) - (long)pcVar2;
    if (lVar8 < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/base.h"
                  ,0x1b6,"negative value");
    }
    if (lVar8 != 0) {
      lVar4 = 0;
      local_30[4] = '\0';
      local_30[5] = '\0';
      local_30[6] = '\0';
      local_30[0] = '\0';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      do {
        ptr = (char *)CONCAT71((int7)((ulong)ptr >> 8),pcVar2[lVar4]);
        local_30[lVar4] = pcVar2[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar8 != lVar4);
      pcVar2 = local_30;
      do {
        pcVar2 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h:1412:25)>
                 ::anon_class_8_1_54a39806::operator()((anon_class_8_1_54a39806 *)this,pcVar2,ptr);
        if (pcVar2 == (char *)0x0) break;
        ptr = extraout_RDX_00;
      } while (pcVar2 < local_30 + lVar8);
    }
  }
  else {
    do {
      if (pcVar6 + (long)pcVar5 + -3 <= pcVar2) goto LAB_001d8fd5;
      pcVar2 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h:1412:25)>
               ::anon_class_8_1_54a39806::operator()((anon_class_8_1_54a39806 *)this,pcVar2,ptr);
      ptr = extraout_RDX;
    } while (pcVar2 != (char *)0x0);
  }
  sVar3 = (this->buffer_).super_buffer<wchar_t>.size_;
  uVar7 = sVar3 + 1;
  if ((this->buffer_).super_buffer<wchar_t>.capacity_ < uVar7) {
    (*(this->buffer_).super_buffer<wchar_t>.grow_)((buffer<wchar_t> *)this,uVar7);
    sVar3 = (this->buffer_).super_buffer<wchar_t>.size_;
    uVar7 = sVar3 + 1;
  }
  pwVar1 = (this->buffer_).super_buffer<wchar_t>.ptr_;
  (this->buffer_).super_buffer<wchar_t>.size_ = uVar7;
  pwVar1[sVar3] = L'\0';
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}